

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O0

void __thiscall
polyscope::render::ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>::
ensureHaveBufferIndexCopyProgram(ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_> *this)

{
  bool bVar1;
  char *in_RDI;
  string *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  string local_48 [32];
  string local_28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0xb8));
  if ((!bVar1) &&
     (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x70)), !bVar1)) {
    std::operator+(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    std::operator+(in_stack_ffffffffffffffa8,in_RDI);
    exception(unaff_retaddr);
    std::__cxx11::string::~string(local_28);
    std::__cxx11::string::~string(local_48);
  }
  return;
}

Assistant:

void ManagedBuffer<T>::ensureHaveBufferIndexCopyProgram() {
  if (bufferIndexCopyProgram) return;

  // sanity check
  if (!renderAttributeBuffer) exception("ManagedBuffer " + name + " asked to copy indices, but has no buffers");

  // TODO allocate the transform feedback program
}